

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

LY_ERR yin_parse_submod(lysp_yin_ctx *ctx,lysp_submodule *submod)

{
  lysp_node **pplVar1;
  yin_subelement *subelems_00;
  LY_ERR LVar2;
  LY_ERR LVar3;
  int iVar4;
  lysp_submodule *plVar5;
  LY_ERR ret__;
  undefined8 in_stack_fffffffffffffcf8;
  undefined4 uVar6;
  yin_subelement *subelems;
  char **local_78;
  lysp_ident **local_70;
  lysp_node_grp **local_68;
  lysp_feature **local_60;
  lysp_ext **local_58;
  lysp_deviation **local_50;
  char **local_48;
  char **local_40;
  lysp_node_augment **local_38;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
  subelems = (yin_subelement *)0x0;
  submod->field_0x79 = submod->field_0x79 | 2;
  LVar2 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar2 == LY_SUCCESS) {
    LVar2 = yin_parse_attribute(ctx,YIN_ARG_NAME,&submod->name,Y_IDENTIF_ARG,LY_STMT_SUBMODULE);
    if (LVar2 == LY_SUCCESS) {
      pplVar1 = &submod->data;
      local_38 = &submod->augments;
      local_40 = &submod->contact;
      local_48 = &submod->dsc;
      local_50 = &submod->deviations;
      local_58 = &submod->extensions;
      local_60 = &submod->features;
      local_68 = &submod->groupings;
      local_70 = &submod->identities;
      local_78 = &submod->name;
      LVar3 = subelems_allocator(ctx,0x1b,(lysp_node *)0x0,&subelems,0x20,pplVar1,CONCAT44(uVar6,8),
                                 0x40,pplVar1,0,0x80,local_38,0,0x30000,submod,3,0x200,pplVar1,0,
                                 0x60000,local_40,2,0x400,pplVar1,0,0x80000,local_48,2,0xa0000,
                                 local_50,0,0xe0000,local_58,0,0x100000,local_60,0,0x800,local_68,0,
                                 0x120000,local_70,0,0x140000,submod->prefix,&submod->imports,0,
                                 0x150000,submod->name,&submod->includes,0,0x1000,pplVar1,0,0x2000,
                                 pplVar1,0,0x4000,pplVar1,0,1,&submod->notifs,0,0x200000,
                                 &submod->org,2,0x270000,&submod->ref,2);
      subelems_00 = subelems;
      LVar2 = LY_EMEM;
      if (LVar3 == LY_SUCCESS) {
        LVar2 = yin_parse_content(ctx,subelems,0x1b,submod,LY_STMT_SUBMODULE,(char **)0x0,
                                  &submod->exts);
        subelems_deallocator(0x1b,subelems_00);
        if ((LVar2 == LY_SUCCESS) &&
           (LVar2 = yin_unres_exts_add(ctx,submod->exts), LVar2 == LY_SUCCESS)) {
          plVar5 = ly_ctx_get_submodule_latest(ctx->xmlctx->ctx,*local_78);
          LVar2 = LY_SUCCESS;
          if ((plVar5 != (lysp_submodule *)0x0) &&
             (iVar4 = strcmp(plVar5->mod->name,submod->mod->name), iVar4 != 0)) {
            ly_vlog((ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
                    ,(char *)0x0,LYVE_SEMANTICS,"Name collision between %s of name \"%s\".",
                    "submodules",plVar5->name);
            LVar2 = LY_EVALID;
          }
        }
      }
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
yin_parse_submod(struct lysp_yin_ctx *ctx, struct lysp_submodule *submod)
{
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    const struct lysp_submodule *dup;
    size_t subelems_size;

    submod->is_submod = 1;

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &submod->name, Y_IDENTIF_ARG, LY_STMT_SUBMODULE));
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 27, NULL, &subelems,
            LY_STMT_ANYDATA, &submod->data, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &submod->data, 0,
            LY_STMT_AUGMENT, &submod->augments, 0,
            LY_STMT_BELONGS_TO, submod, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE,
            LY_STMT_CHOICE, &submod->data, 0,
            LY_STMT_CONTACT, &submod->contact, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &submod->data, 0,
            LY_STMT_DESCRIPTION, &submod->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_DEVIATION, &submod->deviations, 0,
            LY_STMT_EXTENSION, &submod->extensions, 0,
            LY_STMT_FEATURE, &submod->features, 0,
            LY_STMT_GROUPING, &submod->groupings, 0,
            LY_STMT_IDENTITY, &submod->identities, 0,
            LY_STMT_IMPORT, submod->prefix, &submod->imports, 0,
            LY_STMT_INCLUDE, submod->name, &submod->includes, 0,
            LY_STMT_LEAF, &submod->data, 0,
            LY_STMT_LEAF_LIST, &submod->data, 0,
            LY_STMT_LIST, &submod->data, 0,
            LY_STMT_NOTIFICATION, &submod->notifs, 0,
            LY_STMT_ORGANIZATION, &submod->org, YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &submod->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_REVISION, &submod->revs, 0,
            LY_STMT_RPC, &submod->rpcs, 0,
            LY_STMT_TYPEDEF, &submod->typedefs, 0,
            LY_STMT_USES, &submod->data, 0,
            LY_STMT_YANG_VERSION, &submod->version, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));

    ret = yin_parse_content(ctx, subelems, subelems_size, submod, LY_STMT_SUBMODULE, NULL, &submod->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, submod->exts));

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(ctx->xmlctx->ctx, submod->name);
    if (dup && strcmp(dup->mod->name, submod->mod->name)) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_NAME_COL, "submodules", dup->name);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}